

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O0

int tjDecodeYUV(tjhandle handle,uchar *srcBuf,int pad,int subsamp,uchar *dstBuf,int width,int pitch,
               int height,int pixelFormat,int flags)

{
  int iVar1;
  char *pcVar2;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  int in_stack_00000010;
  int ph1;
  int pw1;
  tjinstance *this;
  int retval;
  int strides [3];
  int ph0;
  int pw0;
  uchar *srcPlanes [3];
  int in_stack_00000114;
  uchar *in_stack_00000118;
  int in_stack_00000124;
  int *in_stack_00000128;
  uchar **in_stack_00000130;
  tjhandle in_stack_00000138;
  int in_stack_00000150;
  int in_stack_00000158;
  int in_stack_00000160;
  int in_stack_00000168;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  
  if (in_RDI == 0) {
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"%s","tjDecodeYUV(): Invalid handle");
  }
  else {
    *(undefined4 *)(in_RDI + 0x6d0) = 0;
    if ((((in_RSI != 0) && (-1 < (int)in_EDX)) && ((in_EDX & in_EDX - 1) == 0)) &&
       (((-1 < in_ECX && (in_ECX < 6)) && ((0 < in_R9D && (0 < in_stack_00000010)))))) {
      tjPlaneWidth(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      tjPlaneHeight(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      if (in_ECX != 3) {
        tjPlaneWidth(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
        tjPlaneHeight(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)
        ;
      }
      iVar1 = tjDecodeYUVPlanes(in_stack_00000138,in_stack_00000130,in_stack_00000128,
                                in_stack_00000124,in_stack_00000118,in_stack_00000114,
                                in_stack_00000150,in_stack_00000158,in_stack_00000160,
                                in_stack_00000168);
      return iVar1;
    }
    snprintf((char *)(in_RDI + 0x608),200,"%s","tjDecodeYUV(): Invalid argument");
    *(undefined4 *)(in_RDI + 0x6d0) = 1;
    pcVar2 = (char *)__tls_get_addr(&PTR_001e8fc0);
    snprintf(pcVar2,200,"%s","tjDecodeYUV(): Invalid argument");
  }
  return -1;
}

Assistant:

DLLEXPORT int tjDecodeYUV(tjhandle handle, const unsigned char *srcBuf,
                          int pad, int subsamp, unsigned char *dstBuf,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  const unsigned char *srcPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjDecodeYUV(): Invalid handle");
  this->isInstanceError = FALSE;

  if (srcBuf == NULL || pad < 0 || !IS_POW2(pad) || subsamp < 0 ||
      subsamp >= NUMSUBOPT || width <= 0 || height <= 0)
    THROW("tjDecodeYUV(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  srcPlanes[0] = srcBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    srcPlanes[1] = srcPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    srcPlanes[1] = srcPlanes[0] + strides[0] * ph0;
    srcPlanes[2] = srcPlanes[1] + strides[1] * ph1;
  }

  return tjDecodeYUVPlanes(handle, srcPlanes, strides, subsamp, dstBuf, width,
                           pitch, height, pixelFormat, flags);

bailout:
  return retval;
}